

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  ImVector<ImGuiColumnData> *pIVar1;
  int *piVar2;
  ImRect *pIVar3;
  ImVec2 IVar4;
  ImGuiWindow *this;
  ImGuiColumnsSet *pIVar5;
  ImGuiContext *pIVar6;
  int iVar7;
  ImGuiID IVar8;
  uint uVar9;
  long lVar10;
  ImGuiColumnsSet *pIVar11;
  ImGuiColumnData *pIVar12;
  ImGuiColumnData *pIVar13;
  int iVar14;
  uint uVar15;
  ImGuiContext *g;
  int iVar16;
  ulong uVar17;
  char *str;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  ImGuiColumnsSet local_70;
  
  pIVar6 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (columns_count < 2) {
    __assert_fail("columns_count > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3253,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  if ((this->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
    __assert_fail("window->DC.ColumnsSet == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0x3254,"void ImGui::BeginColumns(const char *, int, ImGuiColumnsFlags)");
  }
  iVar7 = columns_count + 0x11223347;
  if (str_id != (char *)0x0) {
    iVar7 = 0x11223347;
  }
  str = "columns";
  if (str_id != (char *)0x0) {
    str = str_id;
  }
  PushID(iVar7);
  IVar8 = ImGuiWindow::GetID(this,str,(char *)0x0);
  PopID();
  lVar10 = (long)(this->ColumnsStorage).Size;
  if (0 < lVar10) {
    pIVar11 = (this->ColumnsStorage).Data;
    do {
      if (pIVar11->ID == IVar8) goto LAB_0019bebe;
      pIVar11 = pIVar11 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  ImGuiColumnsSet::ImGuiColumnsSet(&local_70);
  iVar7 = (this->ColumnsStorage).Size;
  if (iVar7 == (this->ColumnsStorage).Capacity) {
    if (iVar7 == 0) {
      iVar14 = 8;
    }
    else {
      iVar14 = iVar7 / 2 + iVar7;
    }
    iVar16 = iVar7 + 1;
    if (iVar7 + 1 < iVar14) {
      iVar16 = iVar14;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pIVar11 = (ImGuiColumnsSet *)(*GImAllocatorAllocFunc)((long)iVar16 << 6,GImAllocatorUserData);
    pIVar5 = (this->ColumnsStorage).Data;
    if (pIVar5 != (ImGuiColumnsSet *)0x0) {
      memcpy(pIVar11,pIVar5,(long)(this->ColumnsStorage).Size << 6);
      pIVar5 = (this->ColumnsStorage).Data;
      if (pIVar5 != (ImGuiColumnsSet *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
    }
    (this->ColumnsStorage).Data = pIVar11;
    (this->ColumnsStorage).Capacity = iVar16;
    iVar7 = (this->ColumnsStorage).Size;
  }
  else {
    pIVar11 = (this->ColumnsStorage).Data;
  }
  pIVar1 = &pIVar11[iVar7].Columns;
  pIVar1->Size = local_70.Columns.Size;
  pIVar1->Capacity = local_70.Columns.Capacity;
  pIVar1->Data = local_70.Columns.Data;
  pIVar5 = pIVar11 + iVar7;
  pIVar5->LineMaxY = local_70.LineMaxY;
  pIVar5->StartPosY = local_70.StartPosY;
  *(undefined8 *)(&pIVar5->LineMaxY + 2) = local_70._40_8_;
  piVar2 = &pIVar11[iVar7].Count;
  *piVar2 = local_70.Count;
  piVar2[1] = (int)local_70.MinX;
  piVar2[2] = (int)local_70.MaxX;
  piVar2[3] = (int)local_70.LineMinY;
  pIVar11 = pIVar11 + iVar7;
  pIVar11->ID = local_70.ID;
  pIVar11->Flags = local_70.Flags;
  pIVar11->IsFirstFrame = local_70.IsFirstFrame;
  pIVar11->IsBeingResized = local_70.IsBeingResized;
  *(undefined2 *)&pIVar11->field_0xa = local_70._10_2_;
  pIVar11->Current = local_70.Current;
  uVar9 = (this->ColumnsStorage).Size + 1;
  (this->ColumnsStorage).Size = uVar9;
  if (local_70.Columns.Data != (ImGuiColumnData *)0x0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
    (*GImAllocatorFreeFunc)(local_70.Columns.Data,GImAllocatorUserData);
    uVar9 = (this->ColumnsStorage).Size;
  }
  if ((int)uVar9 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                  ,0x4ca,"value_type &ImVector<ImGuiColumnsSet>::back() [T = ImGuiColumnsSet]");
  }
  pIVar11 = (this->ColumnsStorage).Data + ((ulong)uVar9 - 1);
  pIVar11->ID = IVar8;
LAB_0019bebe:
  pIVar11->Current = 0;
  pIVar11->Count = columns_count;
  pIVar11->Flags = flags;
  (this->DC).ColumnsSet = pIVar11;
  fVar20 = (this->SizeContentsExplicit).x;
  if ((fVar20 != 0.0) || (NAN(fVar20))) {
    fVar18 = (this->Pos).x;
  }
  else {
    fVar18 = (this->Pos).x;
    fVar20 = (this->InnerClipRect).Max.x - fVar18;
  }
  fVar19 = (this->DC).IndentX;
  fVar23 = fVar19 - (pIVar6->Style).ItemSpacing.x;
  pIVar11->MinX = fVar23;
  fVar20 = fVar20 - (this->Scroll).x;
  fVar23 = fVar23 + 1.0;
  uVar9 = -(uint)(fVar23 <= fVar20);
  pIVar11->MaxX = (float)(~uVar9 & (uint)fVar23 | (uint)fVar20 & uVar9);
  fVar20 = (this->DC).CursorPos.y;
  pIVar11->StartPosY = fVar20;
  pIVar11->StartMaxPosX = (this->DC).CursorMaxPos.x;
  pIVar11->LineMaxY = fVar20;
  pIVar11->LineMinY = fVar20;
  (this->DC).ColumnsOffsetX = 0.0;
  (this->DC).CursorPos.x = (float)(int)(fVar18 + fVar19 + 0.0);
  uVar9 = (pIVar11->Columns).Size;
  uVar15 = columns_count + 1;
  if (uVar9 == uVar15 || uVar9 == 0) {
    pIVar11->IsFirstFrame = uVar9 == 0;
    if (uVar9 != 0) goto LAB_0019c1d7;
    iVar7 = (pIVar11->Columns).Capacity;
  }
  else {
    iVar7 = (pIVar11->Columns).Capacity;
    if (iVar7 < 0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      iVar7 = 0;
      pIVar12 = (ImGuiColumnData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      pIVar13 = (pIVar11->Columns).Data;
      if (pIVar13 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar12,pIVar13,(long)(pIVar11->Columns).Size * 0x1c);
        pIVar13 = (pIVar11->Columns).Data;
        if (pIVar13 != (ImGuiColumnData *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
      }
      (pIVar11->Columns).Data = pIVar12;
      (pIVar11->Columns).Capacity = 0;
    }
    (pIVar11->Columns).Size = 0;
    pIVar11->IsFirstFrame = true;
  }
  if (iVar7 <= columns_count) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pIVar12 = (ImGuiColumnData *)(*GImAllocatorAllocFunc)((ulong)uVar15 * 0x1c,GImAllocatorUserData)
    ;
    pIVar13 = (pIVar11->Columns).Data;
    if (pIVar13 != (ImGuiColumnData *)0x0) {
      memcpy(pIVar12,pIVar13,(long)(pIVar11->Columns).Size * 0x1c);
      pIVar13 = (pIVar11->Columns).Data;
      if (pIVar13 != (ImGuiColumnData *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
    }
    (pIVar11->Columns).Data = pIVar12;
    (pIVar11->Columns).Capacity = uVar15;
  }
  iVar7 = (pIVar11->Columns).Size;
  uVar9 = 0;
  do {
    if (iVar7 == (pIVar11->Columns).Capacity) {
      if (iVar7 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = iVar7 / 2 + iVar7;
      }
      iVar16 = iVar7 + 1;
      if (iVar7 + 1 < iVar14) {
        iVar16 = iVar14;
      }
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      pIVar13 = (ImGuiColumnData *)
                (*GImAllocatorAllocFunc)((long)iVar16 * 0x1c,GImAllocatorUserData);
      pIVar12 = (pIVar11->Columns).Data;
      if (pIVar12 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar13,pIVar12,(long)(pIVar11->Columns).Size * 0x1c);
        pIVar12 = (pIVar11->Columns).Data;
        if (pIVar12 != (ImGuiColumnData *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar12,GImAllocatorUserData);
      }
      (pIVar11->Columns).Data = pIVar13;
      (pIVar11->Columns).Capacity = iVar16;
      iVar7 = (pIVar11->Columns).Size;
    }
    else {
      pIVar13 = (pIVar11->Columns).Data;
    }
    pIVar13[iVar7].OffsetNorm = (float)(int)uVar9 / (float)columns_count;
    pIVar13[iVar7].OffsetNormBeforeResize = 0.0;
    pIVar13[iVar7].Flags = 0;
    pIVar3 = &pIVar13[iVar7].ClipRect;
    (pIVar3->Min).x = 3.4028235e+38;
    (pIVar3->Min).y = 3.4028235e+38;
    (pIVar3->Max).x = -3.4028235e+38;
    (pIVar3->Max).y = -3.4028235e+38;
    iVar7 = (pIVar11->Columns).Size + 1;
    (pIVar11->Columns).Size = iVar7;
    uVar9 = uVar9 + 1;
  } while (uVar15 != uVar9);
LAB_0019c1d7:
  lVar10 = 0xc;
  uVar17 = 0;
  do {
    if ((long)(pIVar11->Columns).Size <= (long)uVar17) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4c0,
                    "value_type &ImVector<ImGuiColumnData>::operator[](int) [T = ImGuiColumnData]");
    }
    pIVar13 = (pIVar11->Columns).Data;
    fVar20 = (this->Pos).x;
    fVar18 = GetColumnOffset((int)uVar17);
    fVar18 = (float)(int)(fVar18 + fVar20 + 0.5 + -1.0);
    fVar20 = (this->Pos).x;
    uVar17 = uVar17 + 1;
    fVar19 = GetColumnOffset((int)uVar17);
    fVar20 = (float)(int)(fVar19 + fVar20 + 0.5 + -1.0);
    *(float *)((long)&pIVar13->OffsetNorm + lVar10) = fVar18;
    *(undefined4 *)((long)&pIVar13->OffsetNormBeforeResize + lVar10) = 0xff7fffff;
    *(float *)((long)&pIVar13->Flags + lVar10) = fVar20;
    *(undefined4 *)((long)&(pIVar13->ClipRect).Min.x + lVar10) = 0x7f7fffff;
    IVar4 = (this->ClipRect).Min;
    fVar19 = IVar4.x;
    fVar23 = IVar4.y;
    uVar9 = -(uint)(fVar19 <= fVar18);
    uVar15 = -(uint)(fVar23 <= -3.4028235e+38);
    *(ulong *)((long)&pIVar13->OffsetNorm + lVar10) =
         CONCAT44(~uVar15 & (uint)fVar23,~uVar9 & (uint)fVar19) |
         CONCAT44(uVar15,(uint)fVar18 & uVar9) & 0xff7fffffffffffff;
    auVar21._4_4_ = 0x7f7fffff;
    auVar21._0_4_ = fVar20;
    auVar21._8_8_ = 0;
    auVar22._8_8_ = 0;
    auVar22._0_4_ = (this->ClipRect).Max.x;
    auVar22._4_4_ = (this->ClipRect).Max.y;
    auVar22 = minps(auVar21,auVar22);
    *(long *)((long)&pIVar13->Flags + lVar10) = auVar22._0_8_;
    lVar10 = lVar10 + 0x1c;
  } while ((uint)columns_count != uVar17);
  ImDrawList::ChannelsSplit(this->DrawList,pIVar11->Count);
  PushColumnClipRect(-1);
  fVar20 = GetColumnWidth(-1);
  PushItemWidth(fVar20 * 0.65);
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count > 1);
    IM_ASSERT(window->DC.ColumnsSet == NULL); // Nested columns are currently not supported

    // Differentiate column ID with an arbitrary prefix for cases where users name their columns set the same as another widget.
    // In addition, when an identifier isn't explicitly provided we include the number of columns in the hash to make it uniquer.
    PushID(0x11223347 + (str_id ? 0 : columns_count));
    ImGuiID id = window->GetID(str_id ? str_id : "columns");
    PopID();

    // Acquire storage for the columns set
    ImGuiColumnsSet* columns = FindOrAddColumnsSet(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.ColumnsSet = columns;

    // Set state for first column
    const float content_region_width = (window->SizeContentsExplicit.x != 0.0f) ? (window->SizeContentsExplicit.x) : (window->InnerClipRect.Max.x - window->Pos.x);
    columns->MinX = window->DC.IndentX - g.Style.ItemSpacing.x; // Lock our horizontal range
    columns->MaxX = ImMax(content_region_width - window->Scroll.x, columns->MinX + 1.0f);
    columns->StartPosY = window->DC.CursorPos.y;
    columns->StartMaxPosX = window->DC.CursorMaxPos.x;
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize defaults
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n) - 1.0f);
        float clip_x2 = ImFloor(0.5f + window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    window->DrawList->ChannelsSplit(columns->Count);
    PushColumnClipRect();
    PushItemWidth(GetColumnWidth() * 0.65f);
}